

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

ScalarFunction *
duckdb::AddFunction::GetFunction
          (ScalarFunction *__return_storage_ptr__,LogicalType *left_type,LogicalType *right_type)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  LogicalType varargs_03;
  LogicalType varargs_04;
  LogicalType varargs_05;
  LogicalType varargs_06;
  LogicalType varargs_07;
  LogicalType varargs_08;
  LogicalType varargs_09;
  LogicalType varargs_10;
  LogicalType varargs_11;
  LogicalType varargs_12;
  LogicalType varargs_13;
  LogicalType varargs_14;
  LogicalType varargs_15;
  LogicalType varargs_16;
  bool bVar3;
  NotImplementedException *pNVar4;
  PhysicalType type;
  BaseScalarFunction *this;
  long lVar5;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  initializer_list<duckdb::LogicalType> __l_05;
  initializer_list<duckdb::LogicalType> __l_06;
  initializer_list<duckdb::LogicalType> __l_07;
  initializer_list<duckdb::LogicalType> __l_08;
  initializer_list<duckdb::LogicalType> __l_09;
  initializer_list<duckdb::LogicalType> __l_10;
  initializer_list<duckdb::LogicalType> __l_11;
  initializer_list<duckdb::LogicalType> __l_12;
  initializer_list<duckdb::LogicalType> __l_13;
  initializer_list<duckdb::LogicalType> __l_14;
  initializer_list<duckdb::LogicalType> __l_15;
  initializer_list<duckdb::LogicalType> __l_16;
  undefined4 in_stack_ffffffffffffe90c;
  undefined4 in_stack_ffffffffffffe914;
  string in_stack_ffffffffffffe920;
  element_type *in_stack_ffffffffffffe928;
  LogicalType local_16c8;
  allocator_type local_16a9;
  undefined1 local_16a8 [32];
  _Any_data local_1688;
  code *local_1678;
  undefined8 uStack_1670;
  scalar_function_t local_1668;
  scalar_function_t local_1648;
  scalar_function_t local_1628;
  scalar_function_t local_1608;
  scalar_function_t local_15e8;
  scalar_function_t local_15c8;
  scalar_function_t local_15a8;
  scalar_function_t local_1588;
  scalar_function_t local_1568;
  scalar_function_t local_1548;
  scalar_function_t local_1528;
  scalar_function_t local_1508;
  scalar_function_t local_14e8;
  scalar_function_t local_14c8;
  scalar_function_t local_14a8;
  _Any_data local_1488;
  code *local_1478;
  undefined8 uStack_1470;
  _Any_data local_1460;
  code *local_1450;
  LogicalType local_1440;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1428;
  LogicalType local_1410;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_13f8;
  LogicalType local_13e0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_13c8;
  LogicalType local_13b0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1398;
  LogicalType local_1380;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1368;
  LogicalType local_1350;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1338;
  LogicalType local_1320;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1308;
  LogicalType local_12f0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_12d8;
  LogicalType local_12c0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_12a8;
  LogicalType local_1290;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1278;
  LogicalType local_1260;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1248;
  LogicalType local_1230;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1218;
  LogicalType local_1200;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_11e8;
  LogicalType local_11d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_11b8;
  LogicalType local_11a0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1188;
  LogicalType local_1170;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1158;
  LogicalType local_1140;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1128;
  LogicalType local_1110;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_10f8;
  string local_10e0;
  string local_10c0;
  string local_10a0;
  string local_1080;
  string local_1060;
  string local_1040;
  string local_1020;
  string local_1000;
  string local_fe0;
  string local_fc0;
  string local_fa0;
  string local_f80;
  string local_f60;
  string local_f40;
  string local_f20;
  string local_f00;
  string local_ee0;
  string local_ec0;
  LogicalType local_ea0;
  LogicalType local_e88;
  LogicalType local_e70;
  LogicalType local_e58;
  LogicalType local_e40;
  LogicalType local_e28;
  LogicalType local_e10;
  LogicalType local_df8;
  LogicalType local_de0;
  LogicalType local_dc8;
  LogicalType local_db0;
  LogicalType local_d98;
  LogicalType local_d80;
  LogicalType local_d68;
  LogicalType local_d50;
  LogicalType local_d38;
  LogicalType local_d20;
  LogicalType local_d08;
  string local_cf0;
  string local_cd0;
  string local_cb0;
  BaseScalarFunction local_c90;
  BaseScalarFunction local_be0;
  BaseScalarFunction local_b30;
  BaseScalarFunction local_a80;
  BaseScalarFunction local_9d0;
  BaseScalarFunction local_920;
  BaseScalarFunction local_870;
  BaseScalarFunction local_7c0;
  BaseScalarFunction local_710;
  BaseScalarFunction local_660;
  BaseScalarFunction local_5b0;
  BaseScalarFunction local_500;
  BaseScalarFunction local_450;
  BaseScalarFunction local_3a0;
  BaseScalarFunction local_2f0;
  BaseScalarFunction local_240;
  BaseScalarFunction local_190;
  BaseScalarFunction local_e0;
  
  bVar3 = LogicalType::IsNumeric(left_type);
  if ((bVar3) && (left_type->id_ == right_type->id_)) {
    if (left_type->id_ == DECIMAL) {
      local_ec0._M_dataplus._M_p = (pointer)&local_ec0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_ec0,"+","");
      LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
      LogicalType::LogicalType(&local_16c8,right_type);
      __l._M_len = 2;
      __l._M_array = (iterator)&stack0xffffffffffffe920;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_10f8,__l,(allocator_type *)local_16a8);
      LogicalType::LogicalType(&local_1110,left_type);
      local_1478 = (code *)0x0;
      uStack_1470 = 0;
      local_1488._M_unused._M_object = (void *)0x0;
      local_1488._8_8_ = 0;
      LogicalType::LogicalType(&local_d08,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_d08;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_ffffffffffffe90c;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_ffffffffffffe914;
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_ec0,(vector<duckdb::LogicalType,_true> *)&local_10f8,
                 &local_1110,(scalar_function_t *)&local_1488,
                 BindDecimalAddSubtract<duckdb::AddOperator,duckdb::DecimalAddOverflowCheck,false>,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs,CONSISTENT,
                 (FunctionNullHandling)in_stack_ffffffffffffe920,
                 (bind_lambda_function_t)in_stack_ffffffffffffe928);
      LogicalType::~LogicalType(&local_d08);
      if (local_1478 != (code *)0x0) {
        (*local_1478)(&local_1488,&local_1488,__destroy_functor);
      }
      LogicalType::~LogicalType(&local_1110);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_10f8)
      ;
      lVar5 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ec0._M_dataplus._M_p != &local_ec0.field_2) {
        operator_delete(local_ec0._M_dataplus._M_p);
      }
      BaseScalarFunction::SetReturnsError
                (&local_e0,&__return_storage_ptr__->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      __return_storage_ptr__->serialize = SerializeDecimalArithmetic;
      __return_storage_ptr__->deserialize =
           DeserializeDecimalArithmetic<duckdb::AddOperator,duckdb::DecimalAddOverflowCheck,false>;
      return __return_storage_ptr__;
    }
    bVar3 = LogicalType::IsIntegral(left_type);
    if (bVar3) {
      local_ee0._M_dataplus._M_p = (pointer)&local_ee0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_ee0,"+","");
      LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
      LogicalType::LogicalType(&local_16c8,right_type);
      __l_02._M_len = 2;
      __l_02._M_array = (iterator)&stack0xffffffffffffe920;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_1128,__l_02,&local_16a9);
      LogicalType::LogicalType(&local_1140,left_type);
      PVar2 = left_type->physical_type_;
      local_1688._M_unused._M_object = (void *)0x0;
      local_1688._8_8_ = 0;
      local_1678 = (code *)0x0;
      uStack_1670 = 0;
      switch(PVar2) {
      case UINT8:
        local_16a8._0_8_ =
             ScalarFunction::
             BinaryFunction<unsigned_char,unsigned_char,unsigned_char,duckdb::AddOperatorOverflowCheck>
        ;
        break;
      case INT8:
        local_16a8._0_8_ =
             ScalarFunction::
             BinaryFunction<signed_char,signed_char,signed_char,duckdb::AddOperatorOverflowCheck>;
        break;
      case UINT16:
        local_16a8._0_8_ =
             ScalarFunction::
             BinaryFunction<unsigned_short,unsigned_short,unsigned_short,duckdb::AddOperatorOverflowCheck>
        ;
        break;
      case INT16:
        local_16a8._0_8_ =
             ScalarFunction::BinaryFunction<short,short,short,duckdb::AddOperatorOverflowCheck>;
        break;
      case UINT32:
        local_16a8._0_8_ =
             ScalarFunction::
             BinaryFunction<unsigned_int,unsigned_int,unsigned_int,duckdb::AddOperatorOverflowCheck>
        ;
        break;
      case INT32:
        local_16a8._0_8_ =
             ScalarFunction::BinaryFunction<int,int,int,duckdb::AddOperatorOverflowCheck>;
        break;
      case UINT64:
        local_16a8._0_8_ =
             ScalarFunction::
             BinaryFunction<unsigned_long,unsigned_long,unsigned_long,duckdb::AddOperatorOverflowCheck>
        ;
        break;
      case INT64:
        local_16a8._0_8_ =
             ScalarFunction::BinaryFunction<long,long,long,duckdb::AddOperatorOverflowCheck>;
        break;
      default:
        if (PVar2 == UINT128) {
          local_16a8._0_8_ =
               ScalarFunction::
               BinaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::AddOperatorOverflowCheck>
          ;
        }
        else {
          if (PVar2 != INT128) {
            pNVar4 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            local_16a8._0_8_ = local_16a8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_16a8,"Unimplemented type for GetScalarBinaryFunction: %s","")
            ;
            TypeIdToString_abi_cxx11_(&local_cb0,(duckdb *)(ulong)PVar2,type);
            NotImplementedException::NotImplementedException<std::__cxx11::string>
                      (pNVar4,(string *)local_16a8,&local_cb0);
            __cxa_throw(pNVar4,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          local_16a8._0_8_ =
               ScalarFunction::
               BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::AddOperatorOverflowCheck>
          ;
        }
      }
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                 local_1688._M_pod_data,
                 (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)local_16a8);
      LogicalType::LogicalType(&local_d20,INVALID);
      varargs_16.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_16._0_8_ = &local_d20;
      varargs_16.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_ffffffffffffe90c;
      varargs_16.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_16.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_ffffffffffffe914;
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_ee0,(vector<duckdb::LogicalType,_true> *)&local_1128,
                 &local_1140,(scalar_function_t *)&local_1688,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,
                 PropagateNumericStats<duckdb::TryAddOperator,duckdb::AddPropagateStatistics,duckdb::AddOperator>
                 ,(init_local_state_t)0x0,varargs_16,CONSISTENT,
                 (FunctionNullHandling)in_stack_ffffffffffffe920,
                 (bind_lambda_function_t)in_stack_ffffffffffffe928);
      LogicalType::~LogicalType(&local_d20);
      if (local_1678 != (code *)0x0) {
        (*local_1678)(&local_1688,&local_1688,__destroy_functor);
      }
      LogicalType::~LogicalType(&local_1140);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1128)
      ;
      lVar5 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ee0._M_dataplus._M_p != &local_ee0.field_2) {
        operator_delete(local_ee0._M_dataplus._M_p);
      }
      BaseScalarFunction::SetReturnsError
                (&local_190,&__return_storage_ptr__->super_BaseScalarFunction);
      this = &local_190;
    }
    else {
      local_f00._M_dataplus._M_p = (pointer)&local_f00.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"+","");
      LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
      LogicalType::LogicalType(&local_16c8,right_type);
      __l_07._M_len = 2;
      __l_07._M_array = (iterator)&stack0xffffffffffffe920;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_1158,__l_07,(allocator_type *)local_16a8);
      LogicalType::LogicalType(&local_1170,left_type);
      GetScalarBinaryFunction<duckdb::AddOperator>
                ((scalar_function_t *)&local_1460,left_type->physical_type_);
      LogicalType::LogicalType(&local_d38,INVALID);
      varargs_06.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_06._0_8_ = &local_d38;
      varargs_06.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_ffffffffffffe90c;
      varargs_06.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_06.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_ffffffffffffe914;
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_f00,(vector<duckdb::LogicalType,_true> *)&local_1158,
                 &local_1170,(scalar_function_t *)&local_1460,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs_06,CONSISTENT,
                 (FunctionNullHandling)in_stack_ffffffffffffe920,
                 (bind_lambda_function_t)in_stack_ffffffffffffe928);
      LogicalType::~LogicalType(&local_d38);
      if (local_1450 != (code *)0x0) {
        (*local_1450)(&local_1460,&local_1460,__destroy_functor);
      }
      LogicalType::~LogicalType(&local_1170);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1158)
      ;
      lVar5 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f00._M_dataplus._M_p != &local_f00.field_2) {
        operator_delete(local_f00._M_dataplus._M_p);
      }
      BaseScalarFunction::SetReturnsError
                (&local_240,&__return_storage_ptr__->super_BaseScalarFunction);
      this = &local_240;
    }
  }
  else {
    LVar1 = left_type->id_;
    switch(LVar1) {
    case INTEGER:
      if (right_type->id_ != DATE) goto switchD_0094e7aa_caseD_e;
      local_fa0._M_dataplus._M_p = (pointer)&local_fa0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa0,"+","");
      LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
      LogicalType::LogicalType(&local_16c8,right_type);
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&stack0xffffffffffffe920;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_1248,__l_00,(allocator_type *)local_16a8);
      LogicalType::LogicalType(&local_1260,right_type);
      local_1528.super__Function_base._M_functor._8_8_ = 0;
      local_1528.super__Function_base._M_functor._M_unused._M_object =
           ScalarFunction::BinaryFunction<int,duckdb::date_t,duckdb::date_t,duckdb::AddOperator>;
      local_1528._M_invoker =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_invoke;
      local_1528.super__Function_base._M_manager =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_manager;
      LogicalType::LogicalType(&local_db0,INVALID);
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_00._0_8_ = &local_db0;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_ffffffffffffe90c;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_ffffffffffffe914;
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_fa0,(vector<duckdb::LogicalType,_true> *)&local_1248,
                 &local_1260,&local_1528,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs_00,CONSISTENT,
                 (FunctionNullHandling)in_stack_ffffffffffffe920,
                 (bind_lambda_function_t)in_stack_ffffffffffffe928);
      LogicalType::~LogicalType(&local_db0);
      if (local_1528.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_1528.super__Function_base._M_manager)
                  ((_Any_data *)&local_1528,(_Any_data *)&local_1528,__destroy_functor);
      }
      LogicalType::~LogicalType(&local_1260);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1248)
      ;
      lVar5 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fa0._M_dataplus._M_p != &local_fa0.field_2) {
        operator_delete(local_fa0._M_dataplus._M_p);
      }
      BaseScalarFunction::SetReturnsError
                (&local_5b0,&__return_storage_ptr__->super_BaseScalarFunction);
      this = &local_5b0;
      break;
    case BIGINT:
    case TIMESTAMP_SEC:
    case TIMESTAMP_MS:
switchD_0094e7aa_caseD_e:
      pNVar4 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffe920,"AddFunction for types %s, %s","");
      EnumUtil::ToString<duckdb::LogicalTypeId>(&local_cd0,left_type->id_);
      EnumUtil::ToString<duckdb::LogicalTypeId>(&local_cf0,right_type->id_);
      NotImplementedException::NotImplementedException<std::__cxx11::string,std::__cxx11::string>
                (pNVar4,(string *)&stack0xffffffffffffe920,&local_cd0,&local_cf0);
      __cxa_throw(pNVar4,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    case DATE:
      LVar1 = right_type->id_;
      if (LVar1 < INTERVAL) {
        if (LVar1 == INTEGER) {
          local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f20,"+","");
          LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
          LogicalType::LogicalType(&local_16c8,right_type);
          __l_12._M_len = 2;
          __l_12._M_array = (iterator)&stack0xffffffffffffe920;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_1188,__l_12,(allocator_type *)local_16a8);
          LogicalType::LogicalType(&local_11a0,DATE);
          local_14a8.super__Function_base._M_functor._8_8_ = 0;
          local_14a8.super__Function_base._M_functor._M_unused._M_object =
               ScalarFunction::BinaryFunction<duckdb::date_t,int,duckdb::date_t,duckdb::AddOperator>
          ;
          local_14a8._M_invoker =
               ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
          local_14a8.super__Function_base._M_manager =
               ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
          LogicalType::LogicalType(&local_d50,INVALID);
          varargs_11.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_11._0_8_ = &local_d50;
          varargs_11.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_ffffffffffffe90c;
          varargs_11.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_11.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_ffffffffffffe914;
          ScalarFunction::ScalarFunction
                    (__return_storage_ptr__,&local_f20,
                     (vector<duckdb::LogicalType,_true> *)&local_1188,&local_11a0,&local_14a8,
                     (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                     (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_11,CONSISTENT,
                     (FunctionNullHandling)in_stack_ffffffffffffe920,
                     (bind_lambda_function_t)in_stack_ffffffffffffe928);
          LogicalType::~LogicalType(&local_d50);
          if (local_14a8.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_14a8.super__Function_base._M_manager)
                      ((_Any_data *)&local_14a8,(_Any_data *)&local_14a8,__destroy_functor);
          }
          LogicalType::~LogicalType(&local_11a0);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_1188);
          lVar5 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != -0x18);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
            operator_delete(local_f20._M_dataplus._M_p);
          }
          BaseScalarFunction::SetReturnsError
                    (&local_2f0,&__return_storage_ptr__->super_BaseScalarFunction);
          this = &local_2f0;
        }
        else {
          if (LVar1 != TIME) goto switchD_0094e7aa_caseD_e;
          local_f60._M_dataplus._M_p = (pointer)&local_f60.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f60,"+","");
          LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
          LogicalType::LogicalType(&local_16c8,right_type);
          __l_03._M_len = 2;
          __l_03._M_array = (iterator)&stack0xffffffffffffe920;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_11e8,__l_03,(allocator_type *)local_16a8);
          LogicalType::LogicalType(&local_1200,TIMESTAMP);
          local_14e8.super__Function_base._M_functor._8_8_ = 0;
          local_14e8.super__Function_base._M_functor._M_unused._M_object =
               ScalarFunction::
               BinaryFunction<duckdb::date_t,duckdb::dtime_t,duckdb::timestamp_t,duckdb::AddOperator>
          ;
          local_14e8._M_invoker =
               ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
          local_14e8.super__Function_base._M_manager =
               ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
          LogicalType::LogicalType(&local_d80,INVALID);
          varargs_02.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_02._0_8_ = &local_d80;
          varargs_02.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_ffffffffffffe90c;
          varargs_02.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_02.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_ffffffffffffe914;
          ScalarFunction::ScalarFunction
                    (__return_storage_ptr__,&local_f60,
                     (vector<duckdb::LogicalType,_true> *)&local_11e8,&local_1200,&local_14e8,
                     (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                     (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_02,CONSISTENT,
                     (FunctionNullHandling)in_stack_ffffffffffffe920,
                     (bind_lambda_function_t)in_stack_ffffffffffffe928);
          LogicalType::~LogicalType(&local_d80);
          if (local_14e8.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_14e8.super__Function_base._M_manager)
                      ((_Any_data *)&local_14e8,(_Any_data *)&local_14e8,__destroy_functor);
          }
          LogicalType::~LogicalType(&local_1200);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_11e8);
          lVar5 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != -0x18);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f60._M_dataplus._M_p != &local_f60.field_2) {
            operator_delete(local_f60._M_dataplus._M_p);
          }
          BaseScalarFunction::SetReturnsError
                    (&local_450,&__return_storage_ptr__->super_BaseScalarFunction);
          this = &local_450;
        }
      }
      else if (LVar1 == INTERVAL) {
        local_f40._M_dataplus._M_p = (pointer)&local_f40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f40,"+","");
        LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
        LogicalType::LogicalType(&local_16c8,right_type);
        __l_13._M_len = 2;
        __l_13._M_array = (iterator)&stack0xffffffffffffe920;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_11b8,__l_13,(allocator_type *)local_16a8);
        LogicalType::LogicalType(&local_11d0,TIMESTAMP);
        local_14c8.super__Function_base._M_functor._8_8_ = 0;
        local_14c8.super__Function_base._M_functor._M_unused._M_object =
             ScalarFunction::
             BinaryFunction<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::AddOperator>
        ;
        local_14c8._M_invoker =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
        local_14c8.super__Function_base._M_manager =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
        LogicalType::LogicalType(&local_d68,INVALID);
        varargs_12.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_12._0_8_ = &local_d68;
        varargs_12.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_ffffffffffffe90c;
        varargs_12.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_12.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_ffffffffffffe914;
        ScalarFunction::ScalarFunction
                  (__return_storage_ptr__,&local_f40,
                   (vector<duckdb::LogicalType,_true> *)&local_11b8,&local_11d0,&local_14c8,
                   (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                   (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_12,CONSISTENT,
                   (FunctionNullHandling)in_stack_ffffffffffffe920,
                   (bind_lambda_function_t)in_stack_ffffffffffffe928);
        LogicalType::~LogicalType(&local_d68);
        if (local_14c8.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_14c8.super__Function_base._M_manager)
                    ((_Any_data *)&local_14c8,(_Any_data *)&local_14c8,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_11d0);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_11b8);
        lVar5 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != -0x18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f40._M_dataplus._M_p != &local_f40.field_2) {
          operator_delete(local_f40._M_dataplus._M_p);
        }
        BaseScalarFunction::SetReturnsError
                  (&local_3a0,&__return_storage_ptr__->super_BaseScalarFunction);
        this = &local_3a0;
      }
      else {
        if (LVar1 != TIME_TZ) goto switchD_0094e7aa_caseD_e;
        local_f80._M_dataplus._M_p = (pointer)&local_f80.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f80,"+","");
        LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
        LogicalType::LogicalType(&local_16c8,right_type);
        __l_08._M_len = 2;
        __l_08._M_array = (iterator)&stack0xffffffffffffe920;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_1218,__l_08,(allocator_type *)local_16a8);
        LogicalType::LogicalType(&local_1230,TIMESTAMP_TZ);
        local_1508.super__Function_base._M_functor._8_8_ = 0;
        local_1508.super__Function_base._M_functor._M_unused._M_object =
             ScalarFunction::
             BinaryFunction<duckdb::date_t,duckdb::dtime_tz_t,duckdb::timestamp_t,duckdb::AddOperator>
        ;
        local_1508._M_invoker =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
        local_1508.super__Function_base._M_manager =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
        LogicalType::LogicalType(&local_d98,INVALID);
        varargs_07.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_07._0_8_ = &local_d98;
        varargs_07.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_ffffffffffffe90c;
        varargs_07.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_07.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_ffffffffffffe914;
        ScalarFunction::ScalarFunction
                  (__return_storage_ptr__,&local_f80,
                   (vector<duckdb::LogicalType,_true> *)&local_1218,&local_1230,&local_1508,
                   (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                   (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_07,CONSISTENT,
                   (FunctionNullHandling)in_stack_ffffffffffffe920,
                   (bind_lambda_function_t)in_stack_ffffffffffffe928);
        LogicalType::~LogicalType(&local_d98);
        if (local_1508.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_1508.super__Function_base._M_manager)
                    ((_Any_data *)&local_1508,(_Any_data *)&local_1508,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_1230);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_1218);
        lVar5 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != -0x18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f80._M_dataplus._M_p != &local_f80.field_2) {
          operator_delete(local_f80._M_dataplus._M_p);
        }
        BaseScalarFunction::SetReturnsError
                  (&local_500,&__return_storage_ptr__->super_BaseScalarFunction);
        this = &local_500;
      }
      break;
    case TIME:
      if (right_type->id_ == DATE) {
        local_1080._M_dataplus._M_p = (pointer)&local_1080.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1080,"+","");
        LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
        LogicalType::LogicalType(&local_16c8,right_type);
        __l_09._M_len = 2;
        __l_09._M_array = (iterator)&stack0xffffffffffffe920;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_1398,__l_09,(allocator_type *)local_16a8);
        LogicalType::LogicalType(&local_13b0,TIMESTAMP);
        local_1608.super__Function_base._M_functor._8_8_ = 0;
        local_1608.super__Function_base._M_functor._M_unused._M_object =
             ScalarFunction::
             BinaryFunction<duckdb::dtime_t,duckdb::date_t,duckdb::timestamp_t,duckdb::AddOperator>;
        local_1608._M_invoker =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
        local_1608.super__Function_base._M_manager =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
        LogicalType::LogicalType(&local_e58,INVALID);
        varargs_08.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_08._0_8_ = &local_e58;
        varargs_08.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_ffffffffffffe90c;
        varargs_08.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_08.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_ffffffffffffe914;
        ScalarFunction::ScalarFunction
                  (__return_storage_ptr__,&local_1080,
                   (vector<duckdb::LogicalType,_true> *)&local_1398,&local_13b0,&local_1608,
                   (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                   (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_08,CONSISTENT,
                   (FunctionNullHandling)in_stack_ffffffffffffe920,
                   (bind_lambda_function_t)in_stack_ffffffffffffe928);
        LogicalType::~LogicalType(&local_e58);
        if (local_1608.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_1608.super__Function_base._M_manager)
                    ((_Any_data *)&local_1608,(_Any_data *)&local_1608,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_13b0);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_1398);
        lVar5 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != -0x18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1080._M_dataplus._M_p != &local_1080.field_2) {
          operator_delete(local_1080._M_dataplus._M_p);
        }
        BaseScalarFunction::SetReturnsError
                  (&local_a80,&__return_storage_ptr__->super_BaseScalarFunction);
        this = &local_a80;
      }
      else {
        if (right_type->id_ != INTERVAL) goto switchD_0094e7aa_caseD_e;
        local_1060._M_dataplus._M_p = (pointer)&local_1060.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1060,"+","");
        LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
        LogicalType::LogicalType(&local_16c8,right_type);
        __l_04._M_len = 2;
        __l_04._M_array = (iterator)&stack0xffffffffffffe920;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_1368,__l_04,(allocator_type *)local_16a8);
        LogicalType::LogicalType(&local_1380,TIME);
        local_15e8.super__Function_base._M_functor._8_8_ = 0;
        local_15e8.super__Function_base._M_functor._M_unused._M_object =
             ScalarFunction::
             BinaryFunction<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t,duckdb::AddTimeOperator>
        ;
        local_15e8._M_invoker =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
        local_15e8.super__Function_base._M_manager =
             ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
        LogicalType::LogicalType(&local_e40,INVALID);
        varargs_03.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_03._0_8_ = &local_e40;
        varargs_03.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_ffffffffffffe90c;
        varargs_03.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_03.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_ffffffffffffe914;
        ScalarFunction::ScalarFunction
                  (__return_storage_ptr__,&local_1060,
                   (vector<duckdb::LogicalType,_true> *)&local_1368,&local_1380,&local_15e8,
                   (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                   (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_03,CONSISTENT,
                   (FunctionNullHandling)in_stack_ffffffffffffe920,
                   (bind_lambda_function_t)in_stack_ffffffffffffe928);
        LogicalType::~LogicalType(&local_e40);
        if (local_15e8.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_15e8.super__Function_base._M_manager)
                    ((_Any_data *)&local_15e8,(_Any_data *)&local_15e8,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_1380);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_1368);
        lVar5 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != -0x18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1060._M_dataplus._M_p != &local_1060.field_2) {
          operator_delete(local_1060._M_dataplus._M_p);
        }
        BaseScalarFunction::SetReturnsError
                  (&local_9d0,&__return_storage_ptr__->super_BaseScalarFunction);
        this = &local_9d0;
      }
      break;
    case TIMESTAMP:
      if (right_type->id_ != INTERVAL) goto switchD_0094e7aa_caseD_e;
      local_10e0._M_dataplus._M_p = (pointer)&local_10e0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_10e0,"+","");
      LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
      LogicalType::LogicalType(&local_16c8,right_type);
      __l_05._M_len = 2;
      __l_05._M_array = (iterator)&stack0xffffffffffffe920;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_1428,__l_05,(allocator_type *)local_16a8);
      LogicalType::LogicalType(&local_1440,TIMESTAMP);
      local_1668.super__Function_base._M_functor._8_8_ = 0;
      local_1668.super__Function_base._M_functor._M_unused._M_object =
           ScalarFunction::
           BinaryFunction<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::AddOperator>
      ;
      local_1668._M_invoker =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_invoke;
      local_1668.super__Function_base._M_manager =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_manager;
      LogicalType::LogicalType(&local_ea0,INVALID);
      varargs_04.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_04._0_8_ = &local_ea0;
      varargs_04.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_ffffffffffffe90c;
      varargs_04.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_04.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_ffffffffffffe914;
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_10e0,(vector<duckdb::LogicalType,_true> *)&local_1428
                 ,&local_1440,&local_1668,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs_04,CONSISTENT,
                 (FunctionNullHandling)in_stack_ffffffffffffe920,
                 (bind_lambda_function_t)in_stack_ffffffffffffe928);
      LogicalType::~LogicalType(&local_ea0);
      if (local_1668.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_1668.super__Function_base._M_manager)
                  ((_Any_data *)&local_1668,(_Any_data *)&local_1668,__destroy_functor);
      }
      LogicalType::~LogicalType(&local_1440);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1428)
      ;
      lVar5 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10e0._M_dataplus._M_p != &local_10e0.field_2) {
        operator_delete(local_10e0._M_dataplus._M_p);
      }
      BaseScalarFunction::SetReturnsError
                (&local_c90,&__return_storage_ptr__->super_BaseScalarFunction);
      this = &local_c90;
      break;
    default:
      if (LVar1 == INTERVAL) {
        LVar1 = right_type->id_;
        if (LVar1 < TIMESTAMP) {
          if (LVar1 == DATE) {
            local_fe0._M_dataplus._M_p = (pointer)&local_fe0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"+","");
            LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
            LogicalType::LogicalType(&local_16c8,right_type);
            __l_16._M_len = 2;
            __l_16._M_array = (iterator)&stack0xffffffffffffe920;
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                      (&local_12a8,__l_16,(allocator_type *)local_16a8);
            LogicalType::LogicalType(&local_12c0,TIMESTAMP);
            local_1568.super__Function_base._M_functor._8_8_ = 0;
            local_1568.super__Function_base._M_functor._M_unused._M_object =
                 ScalarFunction::
                 BinaryFunction<duckdb::interval_t,duckdb::date_t,duckdb::timestamp_t,duckdb::AddOperator>
            ;
            local_1568._M_invoker =
                 ::std::
                 _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                 ::_M_invoke;
            local_1568.super__Function_base._M_manager =
                 ::std::
                 _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                 ::_M_manager;
            LogicalType::LogicalType(&local_de0,INVALID);
            varargs_15.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
            varargs_15._0_8_ = &local_de0;
            varargs_15.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
                 in_stack_ffffffffffffe90c;
            varargs_15.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _0_4_ = 0;
            varargs_15.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ = in_stack_ffffffffffffe914;
            ScalarFunction::ScalarFunction
                      (__return_storage_ptr__,&local_fe0,
                       (vector<duckdb::LogicalType,_true> *)&local_12a8,&local_12c0,&local_1568,
                       (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                       (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_15,CONSISTENT,
                       (FunctionNullHandling)in_stack_ffffffffffffe920,
                       (bind_lambda_function_t)in_stack_ffffffffffffe928);
            LogicalType::~LogicalType(&local_de0);
            if (local_1568.super__Function_base._M_manager != (_Manager_type)0x0) {
              (*local_1568.super__Function_base._M_manager)
                        ((_Any_data *)&local_1568,(_Any_data *)&local_1568,__destroy_functor);
            }
            LogicalType::~LogicalType(&local_12c0);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                      (&local_12a8);
            lVar5 = 0x18;
            do {
              LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
              lVar5 = lVar5 + -0x18;
            } while (lVar5 != -0x18);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_fe0._M_dataplus._M_p != &local_fe0.field_2) {
              operator_delete(local_fe0._M_dataplus._M_p);
            }
            BaseScalarFunction::SetReturnsError
                      (&local_710,&__return_storage_ptr__->super_BaseScalarFunction);
            this = &local_710;
          }
          else {
            if (LVar1 != TIME) goto switchD_0094e7aa_caseD_e;
            local_1000._M_dataplus._M_p = (pointer)&local_1000.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1000,"+","");
            LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
            LogicalType::LogicalType(&local_16c8,right_type);
            __l_11._M_len = 2;
            __l_11._M_array = (iterator)&stack0xffffffffffffe920;
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                      (&local_12d8,__l_11,(allocator_type *)local_16a8);
            LogicalType::LogicalType(&local_12f0,TIME);
            local_1588.super__Function_base._M_functor._8_8_ = 0;
            local_1588.super__Function_base._M_functor._M_unused._M_object =
                 ScalarFunction::
                 BinaryFunction<duckdb::interval_t,duckdb::dtime_t,duckdb::dtime_t,duckdb::AddTimeOperator>
            ;
            local_1588._M_invoker =
                 ::std::
                 _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                 ::_M_invoke;
            local_1588.super__Function_base._M_manager =
                 ::std::
                 _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                 ::_M_manager;
            LogicalType::LogicalType(&local_df8,INVALID);
            varargs_10.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
            varargs_10._0_8_ = &local_df8;
            varargs_10.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
                 in_stack_ffffffffffffe90c;
            varargs_10.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _0_4_ = 0;
            varargs_10.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ = in_stack_ffffffffffffe914;
            ScalarFunction::ScalarFunction
                      (__return_storage_ptr__,&local_1000,
                       (vector<duckdb::LogicalType,_true> *)&local_12d8,&local_12f0,&local_1588,
                       (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                       (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_10,CONSISTENT,
                       (FunctionNullHandling)in_stack_ffffffffffffe920,
                       (bind_lambda_function_t)in_stack_ffffffffffffe928);
            LogicalType::~LogicalType(&local_df8);
            if (local_1588.super__Function_base._M_manager != (_Manager_type)0x0) {
              (*local_1588.super__Function_base._M_manager)
                        ((_Any_data *)&local_1588,(_Any_data *)&local_1588,__destroy_functor);
            }
            LogicalType::~LogicalType(&local_12f0);
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                      (&local_12d8);
            lVar5 = 0x18;
            do {
              LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
              lVar5 = lVar5 + -0x18;
            } while (lVar5 != -0x18);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1000._M_dataplus._M_p != &local_1000.field_2) {
              operator_delete(local_1000._M_dataplus._M_p);
            }
            BaseScalarFunction::SetReturnsError
                      (&local_7c0,&__return_storage_ptr__->super_BaseScalarFunction);
            this = &local_7c0;
          }
        }
        else if (LVar1 == TIMESTAMP) {
          local_1040._M_dataplus._M_p = (pointer)&local_1040.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1040,"+","");
          LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
          LogicalType::LogicalType(&local_16c8,right_type);
          __l_14._M_len = 2;
          __l_14._M_array = (iterator)&stack0xffffffffffffe920;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_1338,__l_14,(allocator_type *)local_16a8);
          LogicalType::LogicalType(&local_1350,TIMESTAMP);
          local_15c8.super__Function_base._M_functor._8_8_ = 0;
          local_15c8.super__Function_base._M_functor._M_unused._M_object =
               ScalarFunction::
               BinaryFunction<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::AddOperator>
          ;
          local_15c8._M_invoker =
               ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
          local_15c8.super__Function_base._M_manager =
               ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
          LogicalType::LogicalType(&local_e28,INVALID);
          varargs_13.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_13._0_8_ = &local_e28;
          varargs_13.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_ffffffffffffe90c;
          varargs_13.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_13.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_ffffffffffffe914;
          ScalarFunction::ScalarFunction
                    (__return_storage_ptr__,&local_1040,
                     (vector<duckdb::LogicalType,_true> *)&local_1338,&local_1350,&local_15c8,
                     (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                     (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_13,CONSISTENT,
                     (FunctionNullHandling)in_stack_ffffffffffffe920,
                     (bind_lambda_function_t)in_stack_ffffffffffffe928);
          LogicalType::~LogicalType(&local_e28);
          if (local_15c8.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_15c8.super__Function_base._M_manager)
                      ((_Any_data *)&local_15c8,(_Any_data *)&local_15c8,__destroy_functor);
          }
          LogicalType::~LogicalType(&local_1350);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_1338);
          lVar5 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != -0x18);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1040._M_dataplus._M_p != &local_1040.field_2) {
            operator_delete(local_1040._M_dataplus._M_p);
          }
          BaseScalarFunction::SetReturnsError
                    (&local_920,&__return_storage_ptr__->super_BaseScalarFunction);
          this = &local_920;
        }
        else if (LVar1 == TIME_TZ) {
          local_1020._M_dataplus._M_p = (pointer)&local_1020.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1020,"+","");
          LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
          LogicalType::LogicalType(&local_16c8,right_type);
          __l_15._M_len = 2;
          __l_15._M_array = (iterator)&stack0xffffffffffffe920;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_1308,__l_15,(allocator_type *)local_16a8);
          LogicalType::LogicalType(&local_1320,TIME_TZ);
          local_15a8.super__Function_base._M_functor._8_8_ = 0;
          local_15a8.super__Function_base._M_functor._M_unused._M_object =
               ScalarFunction::
               BinaryFunction<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::AddTimeOperator>
          ;
          local_15a8._M_invoker =
               ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
          local_15a8.super__Function_base._M_manager =
               ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
          LogicalType::LogicalType(&local_e10,INVALID);
          varargs_14.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_14._0_8_ = &local_e10;
          varargs_14.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_ffffffffffffe90c;
          varargs_14.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_14.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_ffffffffffffe914;
          ScalarFunction::ScalarFunction
                    (__return_storage_ptr__,&local_1020,
                     (vector<duckdb::LogicalType,_true> *)&local_1308,&local_1320,&local_15a8,
                     (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                     (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_14,CONSISTENT,
                     (FunctionNullHandling)in_stack_ffffffffffffe920,
                     (bind_lambda_function_t)in_stack_ffffffffffffe928);
          LogicalType::~LogicalType(&local_e10);
          if (local_15a8.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_15a8.super__Function_base._M_manager)
                      ((_Any_data *)&local_15a8,(_Any_data *)&local_15a8,__destroy_functor);
          }
          LogicalType::~LogicalType(&local_1320);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_1308);
          lVar5 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != -0x18);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1020._M_dataplus._M_p != &local_1020.field_2) {
            operator_delete(local_1020._M_dataplus._M_p);
          }
          BaseScalarFunction::SetReturnsError
                    (&local_870,&__return_storage_ptr__->super_BaseScalarFunction);
          this = &local_870;
        }
        else {
          if (LVar1 != INTERVAL) goto switchD_0094e7aa_caseD_e;
          local_fc0._M_dataplus._M_p = (pointer)&local_fc0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_fc0,"+","");
          LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
          LogicalType::LogicalType(&local_16c8,right_type);
          __l_06._M_len = 2;
          __l_06._M_array = (iterator)&stack0xffffffffffffe920;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_1278,__l_06,(allocator_type *)local_16a8);
          LogicalType::LogicalType(&local_1290,INTERVAL);
          local_1548.super__Function_base._M_functor._8_8_ = 0;
          local_1548.super__Function_base._M_functor._M_unused._M_object =
               ScalarFunction::
               BinaryFunction<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::AddOperator>
          ;
          local_1548._M_invoker =
               ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
          local_1548.super__Function_base._M_manager =
               ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
          LogicalType::LogicalType(&local_dc8,INVALID);
          varargs_05.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_05._0_8_ = &local_dc8;
          varargs_05.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_ffffffffffffe90c;
          varargs_05.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_05.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_ffffffffffffe914;
          ScalarFunction::ScalarFunction
                    (__return_storage_ptr__,&local_fc0,
                     (vector<duckdb::LogicalType,_true> *)&local_1278,&local_1290,&local_1548,
                     (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                     (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_05,CONSISTENT,
                     (FunctionNullHandling)in_stack_ffffffffffffe920,
                     (bind_lambda_function_t)in_stack_ffffffffffffe928);
          LogicalType::~LogicalType(&local_dc8);
          if (local_1548.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_1548.super__Function_base._M_manager)
                      ((_Any_data *)&local_1548,(_Any_data *)&local_1548,__destroy_functor);
          }
          LogicalType::~LogicalType(&local_1290);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_1278);
          lVar5 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != -0x18);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_fc0._M_dataplus._M_p != &local_fc0.field_2) {
            operator_delete(local_fc0._M_dataplus._M_p);
          }
          BaseScalarFunction::SetReturnsError
                    (&local_660,&__return_storage_ptr__->super_BaseScalarFunction);
          this = &local_660;
        }
      }
      else {
        if (LVar1 != TIME_TZ) goto switchD_0094e7aa_caseD_e;
        if (right_type->id_ == INTERVAL) {
          local_10c0._M_dataplus._M_p = (pointer)&local_10c0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_10c0,"+","");
          LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
          LogicalType::LogicalType(&local_16c8,right_type);
          __l_10._M_len = 2;
          __l_10._M_array = (iterator)&stack0xffffffffffffe920;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_13f8,__l_10,(allocator_type *)local_16a8);
          LogicalType::LogicalType(&local_1410,TIME_TZ);
          local_1648.super__Function_base._M_functor._8_8_ = 0;
          local_1648.super__Function_base._M_functor._M_unused._M_object =
               ScalarFunction::
               BinaryFunction<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t,duckdb::AddTimeOperator>
          ;
          local_1648._M_invoker =
               ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
          local_1648.super__Function_base._M_manager =
               ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
          LogicalType::LogicalType(&local_e88,INVALID);
          varargs_09.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_09._0_8_ = &local_e88;
          varargs_09.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_ffffffffffffe90c;
          varargs_09.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_09.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_ffffffffffffe914;
          ScalarFunction::ScalarFunction
                    (__return_storage_ptr__,&local_10c0,
                     (vector<duckdb::LogicalType,_true> *)&local_13f8,&local_1410,&local_1648,
                     (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                     (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_09,CONSISTENT,
                     (FunctionNullHandling)in_stack_ffffffffffffe920,
                     (bind_lambda_function_t)in_stack_ffffffffffffe928);
          LogicalType::~LogicalType(&local_e88);
          if (local_1648.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_1648.super__Function_base._M_manager)
                      ((_Any_data *)&local_1648,(_Any_data *)&local_1648,__destroy_functor);
          }
          LogicalType::~LogicalType(&local_1410);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_13f8);
          lVar5 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != -0x18);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_10c0._M_dataplus._M_p != &local_10c0.field_2) {
            operator_delete(local_10c0._M_dataplus._M_p);
          }
          BaseScalarFunction::SetReturnsError
                    (&local_be0,&__return_storage_ptr__->super_BaseScalarFunction);
          this = &local_be0;
        }
        else {
          if (right_type->id_ != DATE) goto switchD_0094e7aa_caseD_e;
          local_10a0._M_dataplus._M_p = (pointer)&local_10a0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_10a0,"+","");
          LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffe920,left_type);
          LogicalType::LogicalType(&local_16c8,right_type);
          __l_01._M_len = 2;
          __l_01._M_array = (iterator)&stack0xffffffffffffe920;
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                    (&local_13c8,__l_01,(allocator_type *)local_16a8);
          LogicalType::LogicalType(&local_13e0,TIMESTAMP_TZ);
          local_1628.super__Function_base._M_functor._8_8_ = 0;
          local_1628.super__Function_base._M_functor._M_unused._M_object =
               ScalarFunction::
               BinaryFunction<duckdb::dtime_tz_t,duckdb::date_t,duckdb::timestamp_t,duckdb::AddOperator>
          ;
          local_1628._M_invoker =
               ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
          local_1628.super__Function_base._M_manager =
               ::std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
          LogicalType::LogicalType(&local_e70,INVALID);
          varargs_01.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
          varargs_01._0_8_ = &local_e70;
          varargs_01.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
               in_stack_ffffffffffffe90c;
          varargs_01.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_4_ = 0;
          varargs_01.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = in_stack_ffffffffffffe914;
          ScalarFunction::ScalarFunction
                    (__return_storage_ptr__,&local_10a0,
                     (vector<duckdb::LogicalType,_true> *)&local_13c8,&local_13e0,&local_1628,
                     (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                     (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_01,CONSISTENT,
                     (FunctionNullHandling)in_stack_ffffffffffffe920,
                     (bind_lambda_function_t)in_stack_ffffffffffffe928);
          LogicalType::~LogicalType(&local_e70);
          if (local_1628.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_1628.super__Function_base._M_manager)
                      ((_Any_data *)&local_1628,(_Any_data *)&local_1628,__destroy_functor);
          }
          LogicalType::~LogicalType(&local_13e0);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    (&local_13c8);
          lVar5 = 0x18;
          do {
            LogicalType::~LogicalType((LogicalType *)(&stack0xffffffffffffe920 + lVar5));
            lVar5 = lVar5 + -0x18;
          } while (lVar5 != -0x18);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_10a0._M_dataplus._M_p != &local_10a0.field_2) {
            operator_delete(local_10a0._M_dataplus._M_p);
          }
          BaseScalarFunction::SetReturnsError
                    (&local_b30,&__return_storage_ptr__->super_BaseScalarFunction);
          this = &local_b30;
        }
      }
    }
  }
  BaseScalarFunction::~BaseScalarFunction(this);
  return __return_storage_ptr__;
}

Assistant:

ScalarFunction AddFunction::GetFunction(const LogicalType &left_type, const LogicalType &right_type) {
	if (left_type.IsNumeric() && left_type.id() == right_type.id()) {
		if (left_type.id() == LogicalTypeId::DECIMAL) {
			auto function = ScalarFunction("+", {left_type, right_type}, left_type, nullptr,
			                               BindDecimalAddSubtract<AddOperator, DecimalAddOverflowCheck>);
			BaseScalarFunction::SetReturnsError(function);
			function.serialize = SerializeDecimalArithmetic;
			function.deserialize = DeserializeDecimalArithmetic<AddOperator, DecimalAddOverflowCheck>;
			return function;
		} else if (left_type.IsIntegral()) {
			ScalarFunction function("+", {left_type, right_type}, left_type,
			                        GetScalarIntegerFunction<AddOperatorOverflowCheck>(left_type.InternalType()),
			                        nullptr, nullptr,
			                        PropagateNumericStats<TryAddOperator, AddPropagateStatistics, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else {
			ScalarFunction function("+", {left_type, right_type}, left_type,
			                        GetScalarBinaryFunction<AddOperator>(left_type.InternalType()));
			BaseScalarFunction::SetReturnsError(function);
			return function;
		}
	}

	switch (left_type.id()) {
	case LogicalTypeId::DATE:
		if (right_type.id() == LogicalTypeId::INTEGER) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::DATE,
			                        ScalarFunction::BinaryFunction<date_t, int32_t, date_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<date_t, interval_t, timestamp_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIME) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<date_t, dtime_t, timestamp_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIME_TZ) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP_TZ,
			                        ScalarFunction::BinaryFunction<date_t, dtime_tz_t, timestamp_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::INTEGER:
		if (right_type.id() == LogicalTypeId::DATE) {
			ScalarFunction function("+", {left_type, right_type}, right_type,
			                        ScalarFunction::BinaryFunction<int32_t, date_t, date_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::INTERVAL:
		if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::INTERVAL,
			                        ScalarFunction::BinaryFunction<interval_t, interval_t, interval_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::DATE) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<interval_t, date_t, timestamp_t, AddOperator>);
			BaseScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIME) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIME,
			                        ScalarFunction::BinaryFunction<interval_t, dtime_t, dtime_t, AddTimeOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIME_TZ) {
			ScalarFunction function(
			    "+", {left_type, right_type}, LogicalType::TIME_TZ,
			    ScalarFunction::BinaryFunction<interval_t, dtime_tz_t, dtime_tz_t, AddTimeOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::TIMESTAMP) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<interval_t, timestamp_t, timestamp_t, AddOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::TIME:
		if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIME,
			                        ScalarFunction::BinaryFunction<dtime_t, interval_t, dtime_t, AddTimeOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::DATE) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<dtime_t, date_t, timestamp_t, AddOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::TIME_TZ:
		if (right_type.id() == LogicalTypeId::DATE) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP_TZ,
			                        ScalarFunction::BinaryFunction<dtime_tz_t, date_t, timestamp_t, AddOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		} else if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function(
			    "+", {left_type, right_type}, LogicalType::TIME_TZ,
			    ScalarFunction::BinaryFunction<dtime_tz_t, interval_t, dtime_tz_t, AddTimeOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	case LogicalTypeId::TIMESTAMP:
		if (right_type.id() == LogicalTypeId::INTERVAL) {
			ScalarFunction function("+", {left_type, right_type}, LogicalType::TIMESTAMP,
			                        ScalarFunction::BinaryFunction<timestamp_t, interval_t, timestamp_t, AddOperator>);
			ScalarFunction::SetReturnsError(function);
			return function;
		}
		break;
	default:
		break;
	}
	// LCOV_EXCL_START
	throw NotImplementedException("AddFunction for types %s, %s", EnumUtil::ToString(left_type.id()),
	                              EnumUtil::ToString(right_type.id()));
	// LCOV_EXCL_STOP
}